

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O2

void quantize_coeff_phase1
               (__m128i *coeff,__m128i *param,int shift,int scale,__m128i *qcoeff,__m128i *dquan,
               __m128i *sign)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  longlong lVar5;
  longlong lVar6;
  __m128i alVar7;
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  __m128i alVar9;
  undefined1 auVar10 [16];
  
  auVar10._0_4_ = (int)(*coeff)[0] >> 0x1f;
  auVar10._4_4_ = *(int *)((long)*coeff + 4) >> 0x1f;
  auVar10._8_4_ = (int)(*coeff)[1] >> 0x1f;
  auVar10._12_4_ = *(int *)((long)*coeff + 0xc) >> 0x1f;
  alVar7 = (__m128i)(auVar10 | _DAT_0045a120);
  *sign = alVar7;
  alVar7 = (__m128i)pabsd((undefined1  [16])alVar7,(undefined1  [16])*coeff);
  *coeff = alVar7;
  auVar8._0_4_ = (int)alVar7[0] + (int)(*param)[0];
  auVar8._4_4_ = alVar7[0]._4_4_ + *(int *)((long)*param + 4);
  auVar8._8_4_ = (int)alVar7[1] + (int)(*param)[1];
  auVar8._12_4_ = alVar7[1]._4_4_ + *(int *)((long)*param + 0xc);
  alVar9 = (__m128i)pmovzxdq(in_XMM2,auVar8);
  alVar7[0] = (ulong)auVar8._8_4_;
  alVar7[1]._0_4_ = auVar8._12_4_;
  alVar7[1]._4_4_ = 0;
  qcoeff[1] = alVar7;
  *qcoeff = alVar9;
  auVar10 = pmuldq((undefined1  [16])alVar9,(undefined1  [16])param[1]);
  alVar9[0] = auVar10._0_8_ >> (ulong)(uint)shift;
  alVar9[1] = auVar10._8_8_ >> (ulong)(uint)shift;
  *qcoeff = alVar9;
  auVar10 = pmuldq((undefined1  [16])alVar9,(undefined1  [16])param[2]);
  (*dquan)[0] = auVar10._0_8_ >> (ulong)(uint)scale;
  (*dquan)[1] = auVar10._8_8_ >> (ulong)(uint)scale;
  iVar1 = *(int *)((long)*coeff + 4);
  lVar5 = (*coeff)[1];
  iVar2 = *(int *)((long)*coeff + 0xc);
  iVar3 = *(int *)((long)param[3] + 4);
  lVar6 = param[3][1];
  iVar4 = *(int *)((long)param[3] + 0xc);
  *(uint *)qcoeff[2] = -(uint)((int)(*coeff)[0] << scale + 1 < (int)param[3][0]);
  *(uint *)((long)qcoeff[2] + 4) = -(uint)(iVar1 < iVar3);
  *(uint *)(qcoeff[2] + 1) = -(uint)((int)lVar5 < (int)lVar6);
  *(uint *)((long)qcoeff[2] + 0xc) = -(uint)(iVar2 < iVar4);
  return;
}

Assistant:

static inline void quantize_coeff_phase1(__m128i *coeff, const __m128i *param,
                                         const int shift, const int scale,
                                         __m128i *qcoeff, __m128i *dquan,
                                         __m128i *sign) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);

  *sign = _mm_cmplt_epi32(*coeff, zero);
  *sign = _mm_or_si128(*sign, one);
  *coeff = _mm_abs_epi32(*coeff);

  qcoeff[0] = _mm_add_epi32(*coeff, param[0]);
  qcoeff[1] = _mm_unpackhi_epi32(qcoeff[0], zero);
  qcoeff[0] = _mm_unpacklo_epi32(qcoeff[0], zero);

  qcoeff[0] = _mm_mul_epi32(qcoeff[0], param[1]);
  qcoeff[0] = _mm_srli_epi64(qcoeff[0], shift);
  dquan[0] = _mm_mul_epi32(qcoeff[0], param[2]);
  dquan[0] = _mm_srli_epi64(dquan[0], scale);
  const __m128i abs_s = _mm_slli_epi32(*coeff, 1 + scale);
  qcoeff[2] = _mm_cmplt_epi32(abs_s, param[3]);
}